

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ValidateModuleHeader(WasmBinaryReader *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  char16_t *msg;
  FunctionBody *pFVar4;
  
  if ((DAT_01430302 == '\0') && (0x40000000 < (uint)(*(int *)&this->m_end - *(int *)&this->m_pc))) {
    msg = L"Module too big";
  }
  else {
    uVar2 = ReadConst<unsigned_int>(this);
    uVar3 = ReadConst<unsigned_int>(this);
    pFVar4 = (this->m_funcState).body;
    if (pFVar4 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
      this = (WasmBinaryReader *)&DAT_01453738;
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
    }
    else {
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar4);
      if (this->m_readerState == READER_STATE_FUNCTION) {
        pFVar4 = (this->m_funcState).body;
      }
      else {
        pFVar4 = (FunctionBody *)0x0;
      }
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar4);
      this = (WasmBinaryReader *)&DAT_01453738;
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
    }
    if (bVar1 != false) {
      Output::Print(L"Module Header: Magic 0x%x, Version %u",(ulong)uVar2,(ulong)uVar3);
      this = (WasmBinaryReader *)0xdfdeb2;
      Output::Print(L"\n");
      Output::Flush();
    }
    if (uVar2 == 0x6d736100) {
      if ((uVar3 == 1) || (DAT_01430300 == '\0')) {
        return;
      }
      msg = L"Invalid WASM version!";
    }
    else {
      msg = L"Malformed WASM module header!";
    }
  }
  ThrowDecodingError(this,msg);
}

Assistant:

void WasmBinaryReader::ValidateModuleHeader()
{
    uint32 bytesLeft = (uint32)(m_end - m_pc);
    if (bytesLeft > Limits::GetMaxModuleSize())
    {
        ThrowDecodingError(_u("Module too big"));
    }

    uint32 magicNumber = ReadConst<uint32>();
    uint32 version = ReadConst<uint32>();
    TRACE_WASM_DECODER(_u("Module Header: Magic 0x%x, Version %u"), magicNumber, version);
    if (magicNumber != 0x6d736100)
    {
        ThrowDecodingError(_u("Malformed WASM module header!"));
    }

    if (CONFIG_FLAG(WasmCheckVersion))
    {
        if (version != binaryVersion)
        {
            ThrowDecodingError(_u("Invalid WASM version!"));
        }
    }
}